

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_edf1.c
# Opt level: O1

void gga_x_sogga_init(xc_func_type *p)

{
  xc_mix_init(p,2,gga_x_sogga_init::funcs_id,gga_x_sogga_init::funcs_coef);
  xc_func_set_ext_params(*p->func_aux,gga_x_sogga_init::par_pbe);
  xc_func_set_ext_params(p->func_aux[1],gga_x_sogga_init::par_pbe);
  return;
}

Assistant:

static void
gga_x_sogga_init(xc_func_type *p)
{
  static int    funcs_id  [2] = {XC_GGA_X_PBE, XC_GGA_X_RPBE};
  static double funcs_coef[2] = {0.5, 0.5};

  static double par_pbe[] = {0.552, MU_GE};

  xc_mix_init(p, 2, funcs_id, funcs_coef);

  xc_func_set_ext_params (p->func_aux[0], par_pbe);
  xc_func_set_ext_params (p->func_aux[1], par_pbe);
}